

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

String * asl::encodeHex(String *__return_storage_ptr__,byte *data,int n)

{
  char *__s;
  int local_24;
  int i;
  int n_local;
  byte *data_local;
  String *h;
  
  String::String(__return_storage_ptr__,n << 1,n << 1);
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    __s = String::operator[](__return_storage_ptr__,local_24 * 2);
    snprintf(__s,3,"%02x",(ulong)data[local_24]);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeHex(const byte* data, int n)
{
	String h(2*n, 2*n);
	for (int i = 0; i < n; i++)
		snprintf(&h[2*i], 3, "%02x", data[i]);
	return h;
}